

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_test.cc
# Opt level: O0

void __thiscall
Poly1305Test_TestVectors_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,FileTest *t)

{
  pointer *ppuVar1;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar2;
  bool bVar3;
  char *pcVar4;
  uchar *puVar5;
  size_type sVar6;
  Message *pMVar7;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var8;
  reference m;
  char *in_R9;
  AssertHelper local_590;
  Message local_588;
  Span<const_unsigned_char> local_580;
  Bytes local_570;
  Bytes local_560;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_4;
  uint8_t unaligned_out [17];
  uint8_t local_527 [7];
  uint8_t unaligned_key [33];
  Message local_4f8;
  Span<const_unsigned_char> local_4f0;
  Bytes local_4e0;
  Span<const_unsigned_char> local_4d0;
  Bytes local_4c0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_3;
  size_t i;
  Message local_490;
  Span<const_unsigned_char> local_488;
  Bytes local_478;
  Span<const_unsigned_char> local_468;
  Bytes local_458;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_2;
  uint8_t out [16];
  poly1305_state state;
  Message local_220;
  size_type local_218;
  uint local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  Message local_1f0;
  size_type local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1a8;
  Message local_1a0;
  allocator<char> local_191;
  string local_190;
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_138;
  Message local_130;
  allocator<char> local_121;
  string local_120;
  bool local_f9;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8 [3];
  allocator<char> local_99;
  string local_98;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  FileTest *t_local;
  anon_class_1_0_00000001 *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Key",&local_99);
  local_71 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &in.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_98);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar3) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_70,(AssertionResult *)"t->GetBytes(&key, \"Key\")",
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
               ,0x49,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(local_b8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Input",&local_121);
    local_f9 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &mac.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_120);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_f8,&local_f9,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar3) {
      testing::Message::Message(&local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_f8,
                 (AssertionResult *)"t->GetBytes(&in, \"Input\")","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_130);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"MAC",&local_191);
      local_169 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &gtest_ar_.message_,&local_190);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_168,&local_169,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar3) {
        testing::Message::Message(&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_168,
                   (AssertionResult *)"t->GetBytes(&mac, \"MAC\")","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                   ,0x4b,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_1a0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_1dc = 0x20;
        local_1e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_1d8,"32u","key.size()",&local_1dc,&local_1e8);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
        if (!bVar3) {
          testing::Message::Message(&local_1f0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                     ,0x4c,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1.message_,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_1f0);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_20c = 0x10;
          local_218 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &gtest_ar_.message_);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                    ((EqHelper *)local_208,"16u","mac.size()",&local_20c,&local_218);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar3) {
            testing::Message::Message(&local_220);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)(state + 0x1f8),kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                       ,0x4d,pcVar4);
            testing::internal::AssertHelper::operator=((AssertHelper *)(state + 0x1f8),&local_220);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(state + 0x1f8));
            testing::Message::~Message(&local_220);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar3;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &in.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            CRYPTO_poly1305_init((poly1305_state *)(out + 8),puVar5);
            ppuVar1 = &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            CRYPTO_poly1305_update((poly1305_state *)(out + 8),puVar5,sVar6);
            CRYPTO_poly1305_finish((poly1305_state *)(out + 8),(uint8_t *)&gtest_ar_2.message_);
            bssl::Span<unsigned_char_const>::Span<16ul>
                      ((Span<unsigned_char_const> *)&local_468,(uchar (*) [16])&gtest_ar_2.message_)
            ;
            Bytes::Bytes(&local_458,local_468);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_488,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_)
            ;
            Bytes::Bytes(&local_478,local_488);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_448,"Bytes(out)","Bytes(mac)",&local_458,&local_478);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
            if (!bVar3) {
              testing::Message::Message(&local_490);
              pMVar7 = testing::Message::operator<<
                                 (&local_490,(char (*) [29])"Single-shot Poly1305 failed.");
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&i,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                         ,0x55,pcVar4);
              testing::internal::AssertHelper::operator=((AssertHelper *)&i,pMVar7);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
              testing::Message::~Message(&local_490);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &in.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            CRYPTO_poly1305_init((poly1305_state *)(out + 8),puVar5);
            for (gtest_ar_3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl =
                      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0;
                uVar2._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,
                _Var8.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &mac.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage),
                (ulong)uVar2._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl <
                (ulong)_Var8.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
                gtest_ar_3.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )((long)gtest_ar_3.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 1)) {
              m = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)
                             gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
              CRYPTO_poly1305_update((poly1305_state *)(out + 8),m,1);
            }
            CRYPTO_poly1305_finish((poly1305_state *)(out + 8),(uint8_t *)&gtest_ar_2.message_);
            bssl::Span<unsigned_char_const>::Span<16ul>
                      ((Span<unsigned_char_const> *)&local_4d0,(uchar (*) [16])&gtest_ar_2.message_)
            ;
            Bytes::Bytes(&local_4c0,local_4d0);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_4f0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_)
            ;
            Bytes::Bytes(&local_4e0,local_4f0);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_4b0,"Bytes(out)","Bytes(mac)",&local_4c0,&local_4e0);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
            if (!bVar3) {
              testing::Message::Message(&local_4f8);
              pMVar7 = testing::Message::operator<<
                                 (&local_4f8,(char (*) [27])"Streaming Poly1305 failed.");
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)(unaligned_key + 0x20),kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                         ,0x5d,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)(unaligned_key + 0x20),pMVar7);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(unaligned_key + 0x20))
              ;
              testing::Message::~Message(&local_4f8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &in.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            ::OPENSSL_memcpy(local_527,puVar5,0x20);
            CRYPTO_poly1305_init((poly1305_state *)(out + 8),local_527);
            ppuVar1 = &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
            puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
            CRYPTO_poly1305_update((poly1305_state *)(out + 8),puVar5,sVar6);
            CRYPTO_poly1305_finish
                      ((poly1305_state *)(out + 8),
                       (uint8_t *)
                       ((long)&gtest_ar_4.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       + 1));
            Bytes::Bytes(&local_560,
                         (uint8_t *)
                         ((long)&gtest_ar_4.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         + 1),0x10);
            bssl::Span<unsigned_char_const>::
            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((Span<unsigned_char_const> *)&local_580,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_)
            ;
            Bytes::Bytes(&local_570,local_580);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_550,"Bytes(unaligned_out + 1, 16)","Bytes(mac)",&local_560,
                       &local_570);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
            if (!bVar3) {
              testing::Message::Message(&local_588);
              pMVar7 = testing::Message::operator<<
                                 (&local_588,(char (*) [27])"Unaligned Poly1305 failed.");
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
              testing::internal::AssertHelper::AssertHelper
                        (&local_590,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/poly1305/poly1305_test.cc"
                         ,0x67,pcVar4);
              testing::internal::AssertHelper::operator=(&local_590,pMVar7);
              testing::internal::AssertHelper::~AssertHelper(&local_590);
              testing::Message::~Message(&local_588);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
            TestSIMD(0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
            TestSIMD(0x10,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
            TestSIMD(0x20,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
            TestSIMD(0x30,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &mac.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Poly1305Test, TestVectors) {
  FileTestGTest("crypto/poly1305/poly1305_tests.txt", [](FileTest *t) {
    std::vector<uint8_t> key, in, mac;
    ASSERT_TRUE(t->GetBytes(&key, "Key"));
    ASSERT_TRUE(t->GetBytes(&in, "Input"));
    ASSERT_TRUE(t->GetBytes(&mac, "MAC"));
    ASSERT_EQ(32u, key.size());
    ASSERT_EQ(16u, mac.size());

    // Test single-shot operation.
    poly1305_state state;
    CRYPTO_poly1305_init(&state, key.data());
    CRYPTO_poly1305_update(&state, in.data(), in.size());
    uint8_t out[16];
    CRYPTO_poly1305_finish(&state, out);
    EXPECT_EQ(Bytes(out), Bytes(mac)) << "Single-shot Poly1305 failed.";

    // Test streaming byte-by-byte.
    CRYPTO_poly1305_init(&state, key.data());
    for (size_t i = 0; i < in.size(); i++) {
      CRYPTO_poly1305_update(&state, &in[i], 1);
    }
    CRYPTO_poly1305_finish(&state, out);
    EXPECT_EQ(Bytes(out), Bytes(mac)) << "Streaming Poly1305 failed.";

    // Test |CRYPTO_poly1305_init| and |CRYPTO_poly1305_finish| work on
    // unaligned values.
    alignas(8) uint8_t unaligned_key[32 + 1];
    OPENSSL_memcpy(unaligned_key + 1, key.data(), 32);
    CRYPTO_poly1305_init(&state, unaligned_key + 1);
    CRYPTO_poly1305_update(&state, in.data(), in.size());
    alignas(8) uint8_t unaligned_out[16 + 1];
    CRYPTO_poly1305_finish(&state, unaligned_out + 1);
    EXPECT_EQ(Bytes(unaligned_out + 1, 16), Bytes(mac))
        << "Unaligned Poly1305 failed.";

    // Test SIMD stress patterns. OpenSSL's AVX2 assembly needs a multiple of
    // four blocks, so test up to three blocks of excess.
    TestSIMD(0, key, in, mac);
    TestSIMD(16, key, in, mac);
    TestSIMD(32, key, in, mac);
    TestSIMD(48, key, in, mac);
  });
}